

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

uint64_t Catch::anon_unknown_1::estimateClockResolution(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong unaff_RBX;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  bVar6 = false;
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    lVar2 = std::chrono::_V2::system_clock::now();
    do {
      uVar3 = std::chrono::_V2::system_clock::now();
    } while (uVar3 - lVar2 == 0);
    uVar5 = uVar5 + (uVar3 - lVar2);
    if (lVar1 + 3000000000U < uVar3) break;
    bVar6 = 0xf423e < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 1000000) {
LAB_0012a8ce:
      if (bVar6) {
        unaff_RBX = uVar5 / 1000000;
      }
      return unaff_RBX;
    }
  }
  unaff_RBX = uVar5 / (uVar4 + 1);
  goto LAB_0012a8ce;
}

Assistant:

auto getCurrentNanosecondsSinceEpoch() -> uint64_t {
        return std::chrono::duration_cast<std::chrono::nanoseconds>( std::chrono::high_resolution_clock::now().time_since_epoch() ).count();
    }